

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O3

int sock_get_fd(nni_sock *s,uint flag,int *fdp)

{
  int iVar1;
  nni_pollable *in_RAX;
  nni_pollable *local_18;
  nni_pollable *p;
  
  if ((s->s_flags & flag) != 0) {
    local_18 = in_RAX;
    if (flag == 2) {
      iVar1 = nni_msgq_get_sendable(s->s_uwq,&local_18);
    }
    else {
      iVar1 = nni_msgq_get_recvable(s->s_urq,&local_18);
    }
    if (iVar1 == 0) {
      iVar1 = nni_pollable_getfd(local_18,fdp);
    }
    return iVar1;
  }
  return 9;
}

Assistant:

static int
sock_get_fd(nni_sock *s, unsigned flag, int *fdp)
{
	int           rv;
	nni_pollable *p;

	if ((flag & nni_sock_flags(s)) == 0) {
		return (NNG_ENOTSUP);
	}

	if (flag == NNI_PROTO_FLAG_SND) {
		rv = nni_msgq_get_sendable(s->s_uwq, &p);
	} else {
		rv = nni_msgq_get_recvable(s->s_urq, &p);
	}

	if (rv == 0) {
		rv = nni_pollable_getfd(p, fdp);
	}

	return (rv);
}